

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Supermap.hpp
# Opt level: O0

void __thiscall
supermap::Supermap<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long>::Supermap
          (Supermap<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long> *this,
          unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>_>_>
          *innerStorage,
          unique_ptr<supermap::KeyValueShrinkableStorage<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>,_std::default_delete<supermap::KeyValueShrinkableStorage<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>_>_>
          *diskDataStorage,
          function<std::unique_ptr<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>,_supermap::Key<2UL>_>,_std::default_delete<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>,_supermap::Key<2UL>_>_>_>_(supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>,_supermap::Key<2UL>_>_&&)>
          *keyIndexStorageSupplier,
          function<std::unique_ptr<supermap::SortedStoragesList<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>,_supermap::Key<2UL>,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>,_supermap::Key<2UL>_>_>,_std::default_delete<supermap::SortedStoragesList<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>,_supermap::Key<2UL>,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>,_supermap::Key<2UL>_>_>_>_>_()>
          *indexListSupplier,
          function<std::unique_ptr<supermap::FilteringRegister<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_supermap::Key<2UL>_>,_std::default_delete<supermap::FilteringRegister<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_supermap::Key<2UL>_>_>_>_()>
          *registerSupplier,unsigned_long keyIndexBatchSize,double maxNotSortedPart)

{
  char *in_RCX;
  KeyValueStorage<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long> *in_RDI;
  allocator<char> *in_R9;
  _func_int **in_XMM0_Qa;
  _func_int **in_stack_00000008;
  function<std::unique_ptr<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>,_supermap::Key<2UL>_>,_std::default_delete<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>,_supermap::Key<2UL>_>_>_>_(supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>,_supermap::Key<2UL>_>_&&)>
  *in_stack_ffffffffffffff38;
  function<std::unique_ptr<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>,_supermap::Key<2UL>_>,_std::default_delete<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>,_supermap::Key<2UL>_>_>_>_(supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>,_supermap::Key<2UL>_>_&&)>
  *in_stack_ffffffffffffff40;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *this_00;
  function<std::unique_ptr<supermap::SortedStoragesList<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>,_supermap::Key<2UL>,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>,_supermap::Key<2UL>_>_>,_std::default_delete<supermap::SortedStoragesList<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>,_supermap::Key<2UL>,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>,_supermap::Key<2UL>_>_>_>_>_()>
  *in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_58;
  duration<long,_std::ratio<1L,_1000000000L>_> local_50;
  allocator<char> local_45 [13];
  _func_int **local_38;
  
  local_38 = in_XMM0_Qa;
  KeyValueStorage<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long>::KeyValueStorage
            (in_RDI);
  in_RDI->_vptr_KeyValueStorage = (_func_int **)&PTR_add_003918d8;
  this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 1);
  std::
  unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>_>_>
  ::unique_ptr((unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>_>_>
                *)in_stack_ffffffffffffff40,
               (unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>_>_>
                *)in_stack_ffffffffffffff38);
  std::
  unique_ptr<supermap::KeyValueShrinkableStorage<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>,_std::default_delete<supermap::KeyValueShrinkableStorage<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>_>_>
  ::unique_ptr((unique_ptr<supermap::KeyValueShrinkableStorage<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>,_std::default_delete<supermap::KeyValueShrinkableStorage<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>_>_>
                *)in_stack_ffffffffffffff40,
               (unique_ptr<supermap::KeyValueShrinkableStorage<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>,_std::default_delete<supermap::KeyValueShrinkableStorage<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>_>_>
                *)in_stack_ffffffffffffff38);
  std::
  function<std::unique_ptr<supermap::SortedStoragesList<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>,_supermap::Key<2UL>,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>,_supermap::Key<2UL>_>_>,_std::default_delete<supermap::SortedStoragesList<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>,_supermap::Key<2UL>,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>,_supermap::Key<2UL>_>_>_>_>_()>
  ::operator()(in_stack_ffffffffffffff48);
  std::
  function<std::unique_ptr<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>,_supermap::Key<2UL>_>,_std::default_delete<supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>,_supermap::Key<2UL>_>_>_>_(supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>,_supermap::Key<2UL>_>_&&)>
  ::function(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  std::
  function<std::unique_ptr<supermap::SortedStoragesList<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>,_supermap::Key<2UL>,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>,_supermap::Key<2UL>_>_>,_std::default_delete<supermap::SortedStoragesList<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>,_supermap::Key<2UL>,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>,_supermap::Key<2UL>_>_>_>_>_()>
  ::function((function<std::unique_ptr<supermap::SortedStoragesList<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>,_supermap::Key<2UL>,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>,_supermap::Key<2UL>_>_>,_std::default_delete<supermap::SortedStoragesList<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>,_supermap::Key<2UL>,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>,_supermap::Key<2UL>_>_>_>_>_()>
              *)in_stack_ffffffffffffff40,
             (function<std::unique_ptr<supermap::SortedStoragesList<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>,_supermap::Key<2UL>,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>,_supermap::Key<2UL>_>_>,_std::default_delete<supermap::SortedStoragesList<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>,_supermap::Key<2UL>,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>,_supermap::Key<2UL>_>_>_>_>_()>
              *)in_stack_ffffffffffffff38);
  std::
  function<std::unique_ptr<supermap::FilteringRegister<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_supermap::Key<2UL>_>,_std::default_delete<supermap::FilteringRegister<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_supermap::Key<2UL>_>_>_>_()>
  ::function((function<std::unique_ptr<supermap::FilteringRegister<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_supermap::Key<2UL>_>,_std::default_delete<supermap::FilteringRegister<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_supermap::Key<2UL>_>_>_>_()>
              *)in_stack_ffffffffffffff40,
             (function<std::unique_ptr<supermap::FilteringRegister<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_supermap::Key<2UL>_>,_std::default_delete<supermap::FilteringRegister<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_supermap::Key<2UL>_>_>_>_()>
              *)in_stack_ffffffffffffff38);
  in_RDI[0x10]._vptr_KeyValueStorage = in_stack_00000008;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,in_RCX,in_R9);
  std::allocator<char>::~allocator(local_45);
  this_00 = (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
             *)(in_RDI + 0x15);
  local_58.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  local_50.__r = (rep)std::chrono::
                      time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      ::time_since_epoch(&local_58);
  std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&local_50);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine(this_00,(result_type)in_stack_ffffffffffffff38);
  in_RDI[0x286]._vptr_KeyValueStorage = local_38;
  return;
}

Assistant:

explicit Supermap(std::unique_ptr<RamStorageBase> &&innerStorage,
                      std::unique_ptr<DiskStorage> &&diskDataStorage,
                      std::function<std::unique_ptr<IndexStorageBase>(IndexStorageBase &&)> keyIndexStorageSupplier,
                      std::function<std::unique_ptr<IndexStorageListBase>()> indexListSupplier,
                      std::function<std::unique_ptr<RegisterBase>()> registerSupplier,
                      IndexT keyIndexBatchSize,
                      double maxNotSortedPart)
        : innerStorage_(std::move(innerStorage)),
          diskDataStorage_(std::move(diskDataStorage)),
          diskIndex_(indexListSupplier()),
          keyIndexStorageSupplier_(std::move(keyIndexStorageSupplier)),
          indexListSupplier_(std::move(indexListSupplier)),
          registerSupplier_(std::move(registerSupplier)),
          keyIndexBatchSize_(keyIndexBatchSize),
          random(std::chrono::steady_clock::now().time_since_epoch().count()),
          maxNotSortedPart_(maxNotSortedPart) {}